

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.h
# Opt level: O0

void __thiscall Highs::~Highs(Highs *this)

{
  undefined8 *in_RDI;
  vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *unaff_retaddr;
  FILE *log_stream;
  HEkk *this_00;
  
  *in_RDI = &PTR__Highs_0096d658;
  this_00 = (HEkk *)in_RDI[0x1c5];
  if (this_00 != (HEkk *)0x0) {
    fclose((FILE *)this_00);
  }
  PresolveComponent::~PresolveComponent((PresolveComponent *)this_00);
  HighsPresolveLog::~HighsPresolveLog((HighsPresolveLog *)0x43e2e2);
  HEkk::~HEkk(this_00);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::~vector
            ((vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_> *)
             unaff_retaddr);
  HighsIis::~HighsIis((HighsIis *)this_00);
  HighsRanging::~HighsRanging((HighsRanging *)this_00);
  HighsInfo::~HighsInfo((HighsInfo *)this_00);
  HighsOptions::~HighsOptions((HighsOptions *)this_00);
  HighsCallback::~HighsCallback((HighsCallback *)this_00);
  HighsTimer::~HighsTimer((HighsTimer *)this_00);
  HighsModel::~HighsModel((HighsModel *)this_00);
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::~vector(unaff_retaddr);
  HighsModel::~HighsModel((HighsModel *)this_00);
  ICrashInfo::~ICrashInfo((ICrashInfo *)this_00);
  HighsBasis::~HighsBasis((HighsBasis *)this_00);
  HighsSolution::~HighsSolution((HighsSolution *)this_00);
  return;
}

Assistant:

virtual ~Highs() {
    FILE* log_stream = options_.log_options.log_stream;
    if (log_stream != nullptr) {
      assert(log_stream != stdout);
      fclose(log_stream);
    }
  }